

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_MisplacedComma_Test::TestBody(JsonArray_MisplacedComma_Test *this)

{
  bool bVar1;
  error_code *peVar2;
  char *pcVar3;
  error_code eVar4;
  AssertHelper local_558;
  Message local_550;
  error_code local_548;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string local_4e8;
  undefined1 local_4c0 [8];
  parser<json_out_callbacks> p_3;
  Message local_400;
  error_code local_3f8;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398;
  undefined1 local_370 [8];
  parser<json_out_callbacks> p_2;
  Message local_2b0;
  error_code local_2a8;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  undefined1 local_220 [8];
  parser<json_out_callbacks> p_1;
  Message local_160;
  error_code local_158;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_e8;
  undefined1 local_c8 [8];
  parser<json_out_callbacks> p;
  JsonArray_MisplacedComma_Test *this_local;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  local_e8._M_dataplus = (_Alloc_hider)0x0;
  local_e8._1_7_ = 0;
  local_e8._M_string_length = 0;
  p.coordinate_ = (coord)this;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_e8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_c8,(json_out_callbacks *)&local_e8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_e8);
  s_abi_cxx11_(&local_118,"[,",2);
  pstore::json::parser<json_out_callbacks>::input((parser<json_out_callbacks> *)local_c8,&local_118)
  ;
  std::__cxx11::string::~string((string *)&local_118);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar.message_,(parser<json_out_callbacks> *)local_c8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  peVar2 = pstore::json::parser<json_out_callbacks>::last_error
                     ((parser<json_out_callbacks> *)local_c8);
  eVar4 = pstore::json::make_error_code(expected_token);
  local_158._M_cat = eVar4._M_cat;
  local_158._M_value = eVar4._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_148,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",peVar2,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p_1.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p_1.coordinate_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_1.coordinate_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_c8);
  local_248.field_2._M_allocated_capacity = 0;
  local_248.field_2._8_8_ = 0;
  local_248._M_dataplus = (_Alloc_hider)0x0;
  local_248._1_7_ = 0;
  local_248._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_248);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_220,(json_out_callbacks *)&local_248,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_248);
  s_abi_cxx11_(&local_268,"[,1",3);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_220,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar_1.message_,(parser<json_out_callbacks> *)local_220);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  peVar2 = pstore::json::parser<json_out_callbacks>::last_error
                     ((parser<json_out_callbacks> *)local_220);
  eVar4 = pstore::json::make_error_code(expected_token);
  local_2a8._M_cat = eVar4._M_cat;
  local_2a8._M_value = eVar4._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_298,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",peVar2,&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p_2.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p_2.coordinate_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_2.coordinate_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_220);
  local_398.field_2._M_allocated_capacity = 0;
  local_398.field_2._8_8_ = 0;
  local_398._M_dataplus = (_Alloc_hider)0x0;
  local_398._1_7_ = 0;
  local_398._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_398);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_370,(json_out_callbacks *)&local_398,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_398);
  s_abi_cxx11_(&local_3b8,"[1,,2]",6);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_370,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar_2.message_,(parser<json_out_callbacks> *)local_370);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  peVar2 = pstore::json::parser<json_out_callbacks>::last_error
                     ((parser<json_out_callbacks> *)local_370);
  eVar4 = pstore::json::make_error_code(expected_token);
  local_3f8._M_cat = eVar4._M_cat;
  local_3f8._M_value = eVar4._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_3e8,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",peVar2,&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p_3.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p_3.coordinate_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_3.coordinate_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_370);
  local_4e8.field_2._M_allocated_capacity = 0;
  local_4e8.field_2._8_8_ = 0;
  local_4e8._M_dataplus = (_Alloc_hider)0x0;
  local_4e8._1_7_ = 0;
  local_4e8._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_4e8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_4c0,(json_out_callbacks *)&local_4e8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_4e8);
  s_abi_cxx11_(&local_508,"[1 true]",8);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_4c0,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar_3.message_,(parser<json_out_callbacks> *)local_4c0);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  peVar2 = pstore::json::parser<json_out_callbacks>::last_error
                     ((parser<json_out_callbacks> *)local_4c0);
  eVar4 = pstore::json::make_error_code(expected_array_member);
  local_548._M_cat = eVar4._M_cat;
  local_548._M_value = eVar4._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_538,"p.last_error ()",
             "make_error_code (json::error_code::expected_array_member)",peVar2,&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xa9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_4c0);
  return;
}

Assistant:

TEST_F (JsonArray, MisplacedComma) {
    {
        json::parser<json_out_callbacks> p;
        p.input ("[,"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[,1"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[1,,2]"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[1 true]"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
    }
}